

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_wrapper.cc
# Opt level: O2

void __thiscall
prometheus::detail::CurlWrapper::CurlWrapper
          (CurlWrapper *this,function<void_(void_*)> *presetupCurl)

{
  int iVar1;
  void *__args;
  curl_slist *pcVar2;
  runtime_error *this_00;
  
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 8) = 0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  ::std::function<void_(void_*)>::function(&this->presetupCurl_,presetupCurl);
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    __args = (void *)curl_easy_init();
    this->curl_ = __args;
    if (__args == (void *)0x0) {
      curl_global_cleanup();
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(this_00,"Cannot initialize easy curl!");
    }
    else {
      if ((this->presetupCurl_).super__Function_base._M_manager != (_Manager_type)0x0) {
        ::std::function<void_(void_*)>::operator()(&this->presetupCurl_,__args);
      }
      pcVar2 = (curl_slist *)
               curl_slist_append(0,"Content-Type: text/plain; version=0.0.4; charset=utf-8");
      this->optHttpHeader_ = pcVar2;
      if (pcVar2 != (curl_slist *)0x0) {
        return;
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(this_00,"Cannot append the header of the content type");
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(this_00,"Cannot initialize global curl!");
  }
  __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

CurlWrapper::CurlWrapper(std::function<void(CURL*)> presetupCurl)
    : presetupCurl_(presetupCurl) {
  /* In windows, this will init the winsock stuff */
  auto error = curl_global_init(CURL_GLOBAL_ALL);
  if (error) {
    throw std::runtime_error("Cannot initialize global curl!");
  }

  curl_ = curl_easy_init();
  if (!curl_) {
    curl_global_cleanup();
    throw std::runtime_error("Cannot initialize easy curl!");
  }

  if (presetupCurl_) {
    presetupCurl_(curl_);  
  }

  optHttpHeader_ = curl_slist_append(nullptr, CONTENT_TYPE);
  if (!optHttpHeader_) {
    throw std::runtime_error("Cannot append the header of the content type");
  }
}